

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack4_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  
  auVar2 = vpmovsxbd_avx(ZEXT416(0x100c0804));
  uVar1 = *in;
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  auVar3 = vpsrlvd_avx2(auVar14,auVar2);
  auVar18._8_8_ = 0x1800000014;
  auVar18._0_8_ = 0x1800000014;
  auVar7 = vpbroadcastd_avx512f();
  auVar4 = vpsrlvd_avx2(auVar7._0_16_,auVar2);
  auVar5 = vpsrlvd_avx2(auVar7._0_16_,auVar18);
  auVar6 = valignd_avx512vl(ZEXT1632(auVar3),ZEXT1632(auVar3),7);
  auVar6 = vpblendd_avx2(auVar6,ZEXT1632(auVar14),1);
  auVar3 = vpshufd_avx(auVar18,0x50);
  auVar14 = vpsrlvd_avx2(auVar14,auVar3);
  auVar16._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar2;
  auVar16._16_16_ = ZEXT116(1) * auVar14;
  auVar6 = vpblendd_avx2(auVar6,auVar16,0x60);
  auVar7 = vpbroadcastd_avx512f();
  auVar8 = vpmovsxbd_avx512f(_DAT_0019fe90);
  auVar7 = vpermt2d_avx512f(ZEXT3664(CONCAT432(auVar7._32_4_,auVar6)),auVar8,ZEXT1664(auVar4));
  auVar9 = vpmovsxbd_avx512f(_DAT_001ad390);
  auVar7 = vpermt2d_avx512f(auVar7,auVar9,ZEXT1664(auVar5));
  auVar10 = valignd_avx512f(auVar7,auVar7,9);
  auVar11 = vpbroadcastd_avx512f(ZEXT416(0xf));
  auVar7 = vpandd_avx512f(auVar7,auVar11);
  auVar12 = vbroadcasti64x4_avx512f(_DAT_001ad4e0);
  auVar10 = vpsrlvd_avx512f(auVar10,auVar12);
  auVar13._0_28_ = auVar7._0_28_;
  auVar13._28_4_ = auVar10._28_4_;
  auVar13._32_4_ = auVar7._32_4_;
  auVar13._36_4_ = auVar7._36_4_;
  auVar13._40_4_ = auVar7._40_4_;
  auVar13._44_4_ = auVar7._44_4_;
  auVar13._48_4_ = auVar7._48_4_;
  auVar13._52_4_ = auVar7._52_4_;
  auVar13._60_4_ = auVar10._60_4_;
  auVar13._56_4_ = auVar7._56_4_;
  auVar7 = vmovdqu64_avx512f(auVar13);
  *(undefined1 (*) [64])out = auVar7;
  uVar1 = in[2];
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar4 = vpsrlvd_avx2(auVar15,auVar2);
  auVar7 = vpbroadcastd_avx512f();
  auVar2 = vpsrlvd_avx2(auVar7._0_16_,auVar2);
  auVar5 = vpsrlvd_avx2(auVar7._0_16_,auVar18);
  auVar6 = valignd_avx512vl(ZEXT1632(auVar4),ZEXT1632(auVar4),7);
  auVar6 = vpblendd_avx2(auVar6,ZEXT1632(auVar15),1);
  auVar3 = vpsrlvd_avx2(auVar15,auVar3);
  auVar17._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar17._16_16_ = ZEXT116(1) * auVar3;
  auVar6 = vpblendd_avx2(auVar6,auVar17,0x60);
  auVar7 = vpbroadcastd_avx512f();
  auVar7 = vpermt2d_avx512f(ZEXT3664(CONCAT432(auVar7._32_4_,auVar6)),auVar8,ZEXT1664(auVar2));
  auVar7 = vpermt2d_avx512f(auVar7,auVar9,ZEXT1664(auVar5));
  auVar8 = valignd_avx512f(auVar7,auVar7,9);
  auVar7 = vpandd_avx512f(auVar7,auVar11);
  auVar8 = vpsrlvd_avx512f(auVar8,auVar12);
  auVar9._0_28_ = auVar7._0_28_;
  auVar9._28_4_ = auVar8._28_4_;
  auVar9._32_4_ = auVar7._32_4_;
  auVar9._36_4_ = auVar7._36_4_;
  auVar9._40_4_ = auVar7._40_4_;
  auVar9._44_4_ = auVar7._44_4_;
  auVar9._48_4_ = auVar7._48_4_;
  auVar9._52_4_ = auVar7._52_4_;
  auVar9._60_4_ = auVar8._60_4_;
  auVar9._56_4_ = auVar7._56_4_;
  auVar7 = vmovdqu64_avx512f(auVar9);
  *(undefined1 (*) [64])(out + 0x10) = auVar7;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack4_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;

  return in;
}